

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void register_subpage(uc_struct_conflict15 *uc,FlatView *fv,MemoryRegionSection *section)

{
  AddressSpaceDispatch *d;
  undefined8 uVar1;
  uint16_t uVar2;
  MemoryRegionSection *pMVar3;
  MemoryRegion *mr;
  MemoryRegionSection *extraout_RDX;
  MemoryRegionSection *section_00;
  MemoryRegionSection *extraout_RDX_00;
  uint uVar4;
  RAMBlock *addr;
  ulong uVar5;
  ulong uVar6;
  int eidx;
  uint uVar7;
  PhysPageMap local_78;
  undefined8 local_58;
  RAMBlock *local_50;
  undefined1 local_48;
  
  d = (AddressSpaceDispatch *)(uc->address_space_memory).current_map;
  uVar1 = *(undefined8 *)(fv + 1);
  addr = (RAMBlock *)(ulong)((uint)uVar1 & 0xffffc000);
  pMVar3 = phys_page_find(d,(hwaddr)addr);
  local_78.nodes_nb = 0;
  local_78.nodes_nb_alloc = 0;
  local_78.sections_nb = 0x4000;
  local_78.sections_nb_alloc = 0;
  local_78.nodes = (Node *)0x0;
  local_78.sections = (MemoryRegionSection *)0x0;
  local_58 = 0;
  local_48 = 0;
  mr = pMVar3->mr;
  pMVar3 = extraout_RDX;
  local_50 = addr;
  if (mr->subpage == false) {
    if (mr != (MemoryRegion *)(*(long *)(*(long *)&fv->nr + 0x80) + 0x1d0)) {
      __assert_fail("existing->mr->subpage || existing->mr == &(section->mr->uc->io_mem_unassigned)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x372,
                    "void register_subpage(struct uc_struct *, FlatView *, MemoryRegionSection *)");
    }
    mr = (MemoryRegion *)g_malloc0(0x80b0);
    *(uc_struct_conflict15 **)(mr + 1) = uc;
    mr[1].ram_block = addr;
    memory_region_init_io_tricore
              ((uc_struct_conflict15 *)
               (uc->address_space_memory).listeners.tqh_first[1].link.tqe_next,
               (MemoryRegion_conflict *)mr,&subpage_ops,mr,0x4000);
    mr->subpage = true;
    local_78.nodes = (Node *)mr;
    local_78.sections = (MemoryRegionSection *)uc;
    uVar2 = phys_section_add((uc_struct_conflict15 *)&d->map,&local_78,section_00);
    phys_page_set(d,(ulong)((uint)uVar1 >> 0xe),1,uVar2);
    pMVar3 = extraout_RDX_00;
  }
  if (fv->ranges != (FlatRange *)0x0) {
    __assert_fail("r == a",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                  ,0x16,"uint64_t int128_get64(Int128)");
  }
  uVar1 = *(undefined8 *)(fv + 1);
  uVar4 = (uint)uVar1 & 0x3fff;
  uVar6 = *(long *)fv + (ulong)uVar4;
  uVar7 = (int)uVar6 - 1;
  uVar2 = phys_section_add((uc_struct_conflict15 *)&d->map,(PhysPageMap *)fv,pMVar3);
  if ((int)uVar4 <= (int)uVar7 && uVar7 < 0x4000) {
    uVar5 = (ulong)((uint)uVar1 & 0x3fff);
    do {
      *(uint16_t *)((long)&mr[1].ops + uVar5 * 2) = uVar2;
      uVar5 = uVar5 + 1;
    } while ((uVar6 & 0xffffffff) != uVar5);
  }
  return;
}

Assistant:

static void register_subpage(struct uc_struct *uc, FlatView *fv, MemoryRegionSection *section)
{
    AddressSpaceDispatch *d = flatview_to_dispatch(fv);
    subpage_t *subpage;
    hwaddr base = section->offset_within_address_space
        & TARGET_PAGE_MASK;
    MemoryRegionSection *existing = phys_page_find(d, base);
    MemoryRegionSection subsection = {
        .offset_within_address_space = base,
        .size = int128_make64(TARGET_PAGE_SIZE),
    };
    hwaddr start, end;

    assert(existing->mr->subpage || existing->mr == &(section->mr->uc->io_mem_unassigned));

    if (!(existing->mr->subpage)) {
        subpage = subpage_init(uc, fv, base);
        subsection.fv = fv;
        subsection.mr = &subpage->iomem;
        phys_page_set(d, base >> TARGET_PAGE_BITS, 1,
                      phys_section_add(uc, &d->map, &subsection));
    } else {
        subpage = container_of(existing->mr, subpage_t, iomem);
    }
    start = section->offset_within_address_space & ~TARGET_PAGE_MASK;
    end = start + int128_get64(section->size) - 1;
    subpage_register(uc, subpage, start, end,
                     phys_section_add(uc, &d->map, section));
}